

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

HighsInt create(HighsIndexCollection *index_collection,HighsInt from_col,HighsInt to_col,
               HighsInt dimension)

{
  if (to_col < dimension && -1 < from_col) {
    index_collection->dimension_ = dimension;
    index_collection->is_interval_ = true;
    index_collection->from_ = from_col;
    index_collection->to_ = to_col;
    return 0;
  }
  return 1;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection, const HighsInt from_col,
                const HighsInt to_col, const HighsInt dimension) {
  if (from_col < 0) return kIndexCollectionCreateIllegalInterval;
  if (to_col >= dimension) return kIndexCollectionCreateIllegalInterval;
  index_collection.dimension_ = dimension;
  index_collection.is_interval_ = true;
  index_collection.from_ = from_col;
  index_collection.to_ = to_col;
  return kIndexCollectionCreateOk;
}